

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall
OpenMD::SimpleTypeData<OpenMD::UFFAtypeParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::UFFAtypeParameters> *this)

{
  void *in_RDI;
  
  ~SimpleTypeData((SimpleTypeData<OpenMD::UFFAtypeParameters> *)0x2dc258);
  operator_delete(in_RDI,0x80);
  return;
}

Assistant:

SimpleTypeData() : GenericData(), data_(ElemDataType()) {}